

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O0

uint32_t __thiscall mjs::regexp::impl::search(impl *this,wstring_view haystack)

{
  bool bVar1;
  wchar_t *__s;
  size_type sVar2;
  const_reference pvVar3;
  wchar_t *str_end;
  wchar_t *str_beg;
  wcmatch match;
  impl *this_local;
  wstring_view haystack_local;
  
  haystack_local._M_len = (size_t)haystack._M_str;
  this_local = (impl *)haystack._M_len;
  match._M_begin = (wchar_t *)this;
  std::__cxx11::
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>::
  match_results((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                 *)&str_beg);
  __s = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data
                  ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  sVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  bVar1 = std::
          regex_search<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                    (__s,__s + sVar2,
                     (match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                      *)&str_beg,&this->r_,0);
  if (bVar1) {
    pvVar3 = std::__cxx11::
             match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             ::operator[]((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                           *)&str_beg,0);
    haystack_local._M_str._4_4_ =
         (uint32_t)
         ((long)(pvVar3->super_pair<const_wchar_t_*,_const_wchar_t_*>).first - (long)__s >> 2);
  }
  else {
    haystack_local._M_str._4_4_ = 0xffffffff;
  }
  std::__cxx11::
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>::
  ~match_results((match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                  *)&str_beg);
  return haystack_local._M_str._4_4_;
}

Assistant:

uint32_t search(const std::wstring_view haystack) const {
        std::wcmatch match;
        const wchar_t* const str_beg = haystack.data();
        const wchar_t* const str_end = str_beg + haystack.length();
        if (!std::regex_search(str_beg, str_end, match, r_)) {
            return npos;
        }
        return static_cast<uint32_t>(match[0].first - str_beg);
    }